

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compress2(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  size_t sVar1;
  size_t sVar2;
  ZSTD_outBuffer output;
  ZSTD_outBuffer local_30;
  ZSTD_inBuffer local_18;
  
  cctx->streamStage = zcss_init;
  cctx->pledgedSrcSizePlusOne = 0;
  local_30.pos = 0;
  local_18.pos = 0;
  local_30.dst = dst;
  local_30.size = dstCapacity;
  local_18.src = src;
  local_18.size = srcSize;
  sVar1 = ZSTD_compressStream2(cctx,&local_30,&local_18,ZSTD_e_end);
  sVar2 = 0xffffffffffffffba;
  if (sVar1 == 0) {
    sVar2 = local_30.pos;
  }
  if (0xffffffffffffff88 < sVar1) {
    sVar2 = sVar1;
  }
  return sVar2;
}

Assistant:

size_t ZSTD_compress2(ZSTD_CCtx* cctx,
                      void* dst, size_t dstCapacity,
                      const void* src, size_t srcSize)
{
    ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
    {   size_t oPos = 0;
        size_t iPos = 0;
        size_t const result = ZSTD_compressStream2_simpleArgs(cctx,
                                        dst, dstCapacity, &oPos,
                                        src, srcSize, &iPos,
                                        ZSTD_e_end);
        if (ZSTD_isError(result)) return result;
        if (result != 0) {  /* compression not completed, due to lack of output space */
            assert(oPos == dstCapacity);
            return ERROR(dstSize_tooSmall);
        }
        assert(iPos == srcSize);   /* all input is expected consumed */
        return oPos;
    }
}